

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> * __thiscall
AssemblyCode::MoveRegRegCommand::GetIn
          (vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__return_storage_ptr__,
          MoveRegRegCommand *this)

{
  initializer_list<IRT::CTemp> __l;
  allocator_type local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)&this->source);
  __l._M_len = 1;
  __l._M_array = (iterator)local_30;
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::vector(__return_storage_ptr__,__l,&local_31)
  ;
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IRT::CTemp> AssemblyCode::MoveRegRegCommand::GetIn( ) const {
    return { source };
}